

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void __thiscall QApplicationPrivate::openPopup(QApplicationPrivate *this,QWidget *popup)

{
  QWindow *pQVar1;
  QWidget *pQVar2;
  QWidget *pQVar3;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QWidget::windowHandle(popup);
  QGuiApplicationPrivate::activatePopup(pQVar1);
  if (_operator>> == 1) {
    grabForPopup(popup);
  }
  pQVar2 = QWidget::focusWidget(popup);
  pQVar3 = focus_widget;
  if (pQVar2 == (QWidget *)0x0) {
    if ((_operator>> == 1) && (focus_widget != (QWidget *)0x0)) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      QFocusEvent::QFocusEvent((QFocusEvent *)&local_38,FocusOut,PopupFocusReason);
      QCoreApplication::sendEvent(&pQVar3->super_QObject,(QEvent *)&local_38);
      QFocusEvent::~QFocusEvent((QFocusEvent *)&local_38);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  else {
    pQVar3 = QWidget::focusWidget(popup);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QWidget::setFocus(pQVar3,PopupFocusReason);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QApplicationPrivate::openPopup(QWidget *popup)
{
    QGuiApplicationPrivate::activatePopup(popup->windowHandle());

    if (QGuiApplicationPrivate::popupCount() == 1) // grab mouse/keyboard
        grabForPopup(popup);

    // popups are not focus-handled by the window system (the first
    // popup grabbed the keyboard), so we have to do that manually: A
    // new popup gets the focus
    if (popup->focusWidget()) {
        popup->focusWidget()->setFocus(Qt::PopupFocusReason);
    } else if (QGuiApplicationPrivate::popupCount() == 1) { // this was the first popup
        if (QWidget *fw = QApplication::focusWidget()) {
            QFocusEvent e(QEvent::FocusOut, Qt::PopupFocusReason);
            QCoreApplication::sendEvent(fw, &e);
        }
    }
}